

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTcPrsGramNode * __thiscall CTcPrsGramNodeOr::consolidate_or(CTcPrsGramNodeOr *this)

{
  CTcPrsGramNode **ppCVar1;
  CTcPrsGramNode *pCVar2;
  CTcPrsGramNode *pCVar3;
  CTcTokenSource *pCVar4;
  int iVar5;
  undefined4 extraout_var;
  CTcPrsGramNode *pCVar7;
  CTcPrsGramNode **ppCVar8;
  CTcPrsGramNode *pCVar9;
  CTcPrsGramNodeOr *new_or;
  CTcPrsGramNode *pCVar6;
  
  ppCVar1 = &(this->super_CTcPrsGramNodeWithChildren).sub_head_;
  pCVar9 = (this->super_CTcPrsGramNodeWithChildren).sub_head_;
  (this->super_CTcPrsGramNodeWithChildren).sub_head_ = (CTcPrsGramNode *)0x0;
  (this->super_CTcPrsGramNodeWithChildren).sub_tail_ = (CTcPrsGramNode *)0x0;
  while (pCVar9 != (CTcPrsGramNode *)0x0) {
    pCVar4 = &pCVar9->super_CTcTokenSource;
    pCVar9 = pCVar9->next_;
    iVar5 = (*pCVar4->_vptr_CTcTokenSource[3])();
    pCVar6 = (CTcPrsGramNode *)CONCAT44(extraout_var,iVar5);
    iVar5 = (*(pCVar6->super_CTcTokenSource)._vptr_CTcTokenSource[5])(pCVar6);
    if (iVar5 == 0) {
      pCVar7 = (this->super_CTcPrsGramNodeWithChildren).sub_tail_;
      ppCVar8 = &pCVar7->next_;
      if (pCVar7 == (CTcPrsGramNode *)0x0) {
        ppCVar8 = ppCVar1;
      }
      *ppCVar8 = pCVar6;
      (this->super_CTcPrsGramNodeWithChildren).sub_tail_ = pCVar6;
      pCVar6->next_ = (CTcPrsGramNode *)0x0;
    }
    else {
      pCVar7 = (CTcPrsGramNode *)pCVar6[1].super_CTcTokenSource._vptr_CTcTokenSource;
      while (pCVar7 != (CTcPrsGramNode *)0x0) {
        pCVar2 = pCVar7->next_;
        pCVar3 = (this->super_CTcPrsGramNodeWithChildren).sub_tail_;
        ppCVar8 = &pCVar3->next_;
        if (pCVar3 == (CTcPrsGramNode *)0x0) {
          ppCVar8 = ppCVar1;
        }
        *ppCVar8 = pCVar7;
        (this->super_CTcPrsGramNodeWithChildren).sub_tail_ = pCVar7;
        pCVar7->next_ = (CTcPrsGramNode *)0x0;
        pCVar7 = pCVar2;
      }
      pCVar6[1].super_CTcTokenSource._vptr_CTcTokenSource = (_func_int **)0x0;
      pCVar6[1].super_CTcTokenSource.enclosing_src_ = (CTcTokenSource *)0x0;
    }
  }
  return (CTcPrsGramNode *)this;
}

Assistant:

virtual CTcPrsGramNode *consolidate_or()
    {
        CTcPrsGramNode *cur;
        CTcPrsGramNode *nxt;
        CTcPrsGramNode *old_head;

        /*
         *   Consolidate OR's in all subtrees.  If any of our immediate
         *   children turn into OR's, simply pull their children into our OR
         *   list directly - OR(a, OR(b, c)) is equivalent to OR(a, b, c).
         *   
         *   Before we build the new list, stash away our entire subtree,
         *   since we'll rebuild the tree from the updated versions.  
         */
        old_head = sub_head_;
        sub_head_ = sub_tail_ = 0;

        /* run through our list and build the new, consolidated list */
        for (cur = old_head ; cur != 0 ; cur = nxt)
        {
            CTcPrsGramNode *new_sub;

            /* remember the next item in the old list */
            nxt = cur->next_;
            
            /* consolidate OR's in the subtree */
            new_sub = cur->consolidate_or();

            /* 
             *   if this is an OR node, add its children directly to us;
             *   otherwise, add the node itself
             */
            if (new_sub->is_or())
            {
                CTcPrsGramNodeOr *new_or;
                CTcPrsGramNode *chi;
                CTcPrsGramNode *next_chi;

                /* cast it */
                new_or = (CTcPrsGramNodeOr *)new_sub;

                /* add each of the sub-OR's children as our direct children */
                for (chi = new_or->sub_head_ ; chi != 0 ; chi = next_chi)
                {
                    /* remember the next child in the old sub-list */
                    next_chi = chi->next_;

                    /* move it directly to our list */
                    add_sub_item(chi);
                }

                /* the old OR item is now empty of children */
                new_or->sub_head_ = new_or->sub_tail_ = 0;
            }
            else
            {
                /* it's not an OR - add it directly to our list */
                add_sub_item(new_sub);
            }
        }

        /* return myself with no further changes */
        return this;
    }